

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

void __thiscall cmOutputConverter::ComputeRelativePathTopBinary(cmOutputConverter *this)

{
  bool bVar1;
  string *cDir;
  string *psVar2;
  cmStateDirectory local_d0;
  cmStateSnapshot local_a8;
  cmStateDirectory local_90;
  cmStateDirectory local_68;
  undefined1 local_40 [8];
  cmStateSnapshot parent;
  cmStateSnapshot snapshot;
  cmOutputConverter *this_local;
  
  parent.Position.Position = (PositionType)(this->StateSnapshot).State;
  cmStateSnapshot::GetBuildsystemDirectoryParent
            ((cmStateSnapshot *)local_40,(cmStateSnapshot *)&parent.Position.Position);
  while (bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_40), bVar1) {
    cmStateSnapshot::GetDirectory(&local_68,(cmStateSnapshot *)&parent.Position.Position);
    psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_68);
    cmStateSnapshot::GetDirectory(&local_90,(cmStateSnapshot *)local_40);
    cDir = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_90);
    bVar1 = cmsys::SystemTools::IsSubDirectory(psVar2,cDir);
    if (bVar1) {
      parent.Position.Position = (PositionType)local_40;
    }
    cmStateSnapshot::GetBuildsystemDirectoryParent(&local_a8,(cmStateSnapshot *)local_40);
    local_40 = (undefined1  [8])local_a8.State;
  }
  cmStateSnapshot::GetDirectory(&local_d0,(cmStateSnapshot *)&parent.Position.Position);
  psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_d0);
  std::__cxx11::string::operator=((string *)&this->RelativePathTopBinary,(string *)psVar2);
  return;
}

Assistant:

void cmOutputConverter::ComputeRelativePathTopBinary()
{
  // Walk up the buildsystem directory tree to find the highest binary
  // directory that contains the current binary directory.
  cmStateSnapshot snapshot = this->StateSnapshot;
  for (cmStateSnapshot parent = snapshot.GetBuildsystemDirectoryParent();
       parent.IsValid(); parent = parent.GetBuildsystemDirectoryParent()) {
    if (cmSystemTools::IsSubDirectory(
          snapshot.GetDirectory().GetCurrentBinary(),
          parent.GetDirectory().GetCurrentBinary())) {
      snapshot = parent;
    }
  }

  this->RelativePathTopBinary = snapshot.GetDirectory().GetCurrentBinary();
}